

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> it,size_t n,fill_t<char> *fill)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  
  bVar1 = fill->size_;
  if ((ulong)bVar1 == 1) {
    if (n != 0) {
      cVar2 = fill->data_[0];
      do {
        sVar3 = (it.container)->size_;
        uVar4 = sVar3 + 1;
        if ((it.container)->capacity_ < uVar4) {
          (**(it.container)->_vptr_buffer)(it.container);
          sVar3 = (it.container)->size_;
          uVar4 = sVar3 + 1;
        }
        (it.container)->size_ = uVar4;
        (it.container)->ptr_[sVar3] = cVar2;
        n = n - 1;
      } while (n != 0);
    }
  }
  else if (n != 0) {
    do {
      if (bVar1 != 0) {
        it = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                       (fill->data_,fill->data_ + bVar1,it);
      }
      n = n - 1;
    } while (n != 0);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)it.container;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}